

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O2

JL_STATUS VerifyHexString(char *String,size_t StringLength)

{
  long lVar1;
  uint uVar2;
  
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 4) {
      return JL_STATUS_SUCCESS;
    }
    if ((9 < (byte)(String[lVar1] - 0x30U)) &&
       ((uVar2 = (byte)String[lVar1] - 0x41, 0x25 < uVar2 ||
        ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) == 0)))) break;
    lVar1 = lVar1 + 1;
  }
  return JL_STATUS_INVALID_DATA;
}

Assistant:

static
JL_STATUS
    VerifyHexString
    (
        char const*     String,
        size_t          StringLength
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;

    for( size_t i=0; i<StringLength; i++ )
    {
        if(     ( String[i] >= '0' && String[i] <= '9' )
            ||  ( String[i] >= 'A' && String[i] <= 'F' )
            ||  ( String[i] >= 'a' && String[i] <= 'f' ) )
        {
            // A valid hex char
        }
        else
        {
            jlStatus = JL_STATUS_INVALID_DATA;
            break;
        }
    }

    return jlStatus;
}